

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ForkBranch<kj::Own<CallResultHolder>_>::get
          (ForkBranch<kj::Own<CallResultHolder>_> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  char *pcVar2;
  Refcounted *refcounted;
  long *plVar3;
  undefined8 *puVar4;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.field_1.value.ownFile.content.ptr == (char *)0x0) {
    puVar4 = *(undefined8 **)&output[1].exception.ptr;
    plVar3 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    *(undefined8 *)&output[1].exception.ptr = 0;
    output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  }
  else {
    pcVar2 = pEVar1[1].exception.ptr.field_1.value.ownFile.content.ptr;
    *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
    puVar4 = *(undefined8 **)&output[1].exception.ptr;
    plVar3 = (long *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    *(char **)&output[1].exception.ptr = pcVar2;
    output[1].exception.ptr.field_1.value.ownFile.content.ptr = pcVar2;
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)*puVar4)(puVar4,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }